

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

StackVersion
ts_parser__reduce(TSParser *self,StackVersion version,TSSymbol symbol,uint32_t count,
                 int dynamic_precedence,uint16_t alias_sequence_id,_Bool fragile)

{
  int32_t *piVar1;
  SubtreePool *pool;
  StackSlice *pSVar2;
  byte bVar3;
  uint uVar4;
  TSLanguage *self_00;
  uint32_t uVar5;
  undefined8 uVar6;
  StackVersion SVar7;
  Subtree *pSVar8;
  _Bool _Var9;
  TSStateId state;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  ushort state_00;
  int iVar15;
  uint uVar16;
  StackVersion version1;
  int iVar17;
  uint uVar18;
  uint uVar19;
  Subtree SVar20;
  SubtreeHeapData *pSVar21;
  Subtree SVar22;
  int iVar23;
  int iVar24;
  StackSlice *pSVar25;
  ulong uVar26;
  bool bVar27;
  byte bVar28;
  StackSliceArray SVar29;
  StackSlice next_slice;
  StackSlice slice;
  undefined8 local_b0;
  TableEntry local_a8;
  undefined8 local_98;
  Subtree local_90;
  StackVersion local_84;
  uint local_80;
  int local_7c;
  SubtreeArray local_78;
  undefined8 local_68;
  StackSlice *local_58;
  ulong local_50;
  SubtreeArray local_48;
  undefined8 local_38;
  
  bVar28 = 0;
  uVar4 = (self->stack->heads).size;
  local_7c = dynamic_precedence;
  SVar29 = ts_stack_pop_count(self->stack,version,count);
  local_58 = SVar29.contents;
  uVar13 = SVar29.size;
  if (uVar13 != 0) {
    pool = &self->tree_pool;
    local_80 = (uint)alias_sequence_id;
    uVar11 = 0;
    iVar15 = 0;
    local_84 = version;
    do {
      local_b0 = SVar29._8_8_;
      uVar6 = local_b0;
      pSVar25 = SVar29.contents;
      local_68 = *(undefined8 *)&pSVar25[uVar11].version;
      pSVar2 = pSVar25 + uVar11;
      local_78.contents = (pSVar2->subtrees).contents;
      local_78.size = (pSVar2->subtrees).size;
      local_78.capacity = (pSVar2->subtrees).capacity;
      uVar18 = (int)local_68 - iVar15;
      local_b0._0_4_ = SVar29.size;
      uVar10 = (uint)local_b0;
      if (((int)uVar11 == 0) || (uVar18 < 0xb)) {
        uVar26 = local_78._8_8_ & 0xffffffff;
        local_48.size = local_78.size;
        if (uVar26 != 0) {
          do {
            local_48.size = (uint32_t)uVar26;
            uVar26 = uVar26 - 1;
            pSVar21 = local_78.contents[uVar26 & 0xffffffff].ptr;
            if (((ulong)pSVar21 & 1) == 0) {
              uVar16 = *(uint *)&pSVar21->field_0x2c >> 2;
            }
            else {
              uVar16 = (uint)((ulong)pSVar21 >> 3) & 0x1fffffff;
            }
            if ((uVar16 & 1) == 0) goto LAB_00136acf;
          } while ((int)uVar26 != 0);
          local_48.size = 0;
        }
LAB_00136acf:
        local_48.capacity = local_78.capacity;
        local_48.contents = local_78.contents;
        local_38 = local_68;
        local_90 = (Subtree)ts_subtree_new_node(pool,symbol,&local_48,local_80,self->language);
        do {
          SVar22 = local_90;
          uVar16 = (int)uVar11 + 1;
          if ((uint)local_b0 <= uVar16) break;
          local_98 = *(undefined8 *)&pSVar25[uVar16].version;
          pSVar2 = pSVar25 + uVar16;
          local_a8.actions = (TSParseAction *)(pSVar2->subtrees).contents;
          local_a8.action_count = (pSVar2->subtrees).size;
          local_a8._12_4_ = (pSVar2->subtrees).capacity;
          iVar17 = (int)local_68;
          iVar24 = (int)local_98;
          if (iVar24 == (int)local_68) {
            uVar11 = local_a8._8_8_ & 0xffffffff;
            uVar14 = local_a8.action_count + 1;
            do {
              bVar27 = uVar11 == 0;
              uVar11 = uVar11 - 1;
              if (bVar27) {
                uVar14 = 0;
                break;
              }
              pSVar21 = ((Subtree *)local_a8.actions)[uVar11].ptr;
              if (((ulong)pSVar21 & 1) == 0) {
                uVar19 = *(uint *)&pSVar21->field_0x2c >> 2;
              }
              else {
                uVar19 = (uint)((ulong)pSVar21 >> 3) & 0x1fffffff;
              }
              uVar14 = uVar14 - 1;
            } while ((uVar19 & 1) != 0);
            SVar20 = local_90;
            pSVar21 = (self->scratch_tree).ptr;
            for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
              uVar5 = ((Length *)((long)SVar20 + 4))->bytes;
              pSVar21->ref_count = *(uint32_t *)SVar20;
              (pSVar21->padding).bytes = uVar5;
              SVar20.data = SVar20.data + (ulong)bVar28 * -0x10 + 8;
              pSVar21 = (SubtreeHeapData *)((long)pSVar21 + (ulong)bVar28 * -0x10 + 8);
            }
            ((self->scratch_tree).ptr)->child_count = 0;
            ts_subtree_set_children
                      (self->scratch_tree,(Subtree *)local_a8.actions,uVar14,self->language);
            _Var9 = ts_parser__select_tree(self,SVar22,*(Subtree *)&self->scratch_tree);
            if (_Var9) {
              pSVar21 = (self->scratch_tree).ptr;
              for (lVar12 = 0xb; lVar12 != 0; lVar12 = lVar12 + -1) {
                uVar14 = (pSVar21->padding).bytes;
                *(uint32_t *)SVar22 = pSVar21->ref_count;
                ((Length *)((long)SVar22 + 4))->bytes = uVar14;
                pSVar21 = (SubtreeHeapData *)((long)pSVar21 + (ulong)bVar28 * -0x10 + 8);
                SVar22.data = SVar22.data + (ulong)bVar28 * -0x10 + 8;
              }
              ts_subtree_array_delete(pool,&local_78);
              local_68 = local_98;
              local_78.contents = (Subtree *)local_a8.actions;
              local_78._8_8_ = local_a8._8_8_;
            }
            else {
              ts_subtree_array_delete(pool,(SubtreeArray *)&local_a8);
            }
            uVar11 = (ulong)uVar16;
          }
        } while (iVar24 == iVar17);
        piVar1 = &((local_90.ptr)->field_17).field_0.dynamic_precedence;
        *piVar1 = *piVar1 + local_7c;
        ((local_90.ptr)->field_17).field_0.alias_sequence_id = alias_sequence_id;
        if ((self->stack->heads).size <= uVar18) {
          __assert_fail("(uint32_t)version < (&self->heads)->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                        ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
        }
        state_00 = ((self->stack->heads).contents[uVar18].node)->state;
        if (symbol < 0xfffe) {
          self_00 = self->language;
          if ((uint)symbol < self_00->token_count) {
            ts_language_table_entry(self_00,state_00,symbol,&local_a8);
            if (local_a8.action_count != 0) {
              state = *(TSStateId *)(local_a8.actions + (local_a8.action_count - 1));
              bVar3 = *(byte *)((long)local_a8.actions + (ulong)(local_a8.action_count - 1) * 8 + 6)
              ;
              if (((bVar3 & 0xf) == 0) || ((bVar3 & 0xf) == 3)) goto LAB_00136c9b;
            }
            goto LAB_00136c48;
          }
          state = self_00->parse_table[(uint)state_00 * self_00->symbol_count + (uint)symbol];
        }
        else {
LAB_00136c48:
          state = 0;
        }
LAB_00136c9b:
        SVar22 = local_90;
        if (1 < uVar4 || (uVar13 != 1 || fragile)) {
          (local_90.ptr)->field_0x2c = (local_90.ptr)->field_0x2c | 0x18;
          state_00 = TS_TREE_STATE_NONE;
        }
        (local_90.ptr)->parse_state = state_00;
        local_50 = uVar11;
        ts_stack_push(self->stack,uVar18,local_90,false,state);
        pSVar8 = local_78.contents;
        uVar26 = (ulong)(SVar22.ptr)->child_count;
        uVar11 = local_78._8_8_ & 0xffffffff;
        if ((SVar22.ptr)->child_count < local_78.size) {
          do {
            ts_stack_push(self->stack,uVar18,pSVar8[uVar26],false,state);
            uVar26 = uVar26 + 1;
          } while (uVar11 != uVar26);
        }
        pSVar25 = local_58;
        SVar7 = local_84;
        iVar17 = (int)local_50;
        if ((int)local_38 != iVar15) {
          version1 = 0;
          do {
            if ((SVar7 != version1) && (_Var9 = ts_stack_merge(self->stack,version1,uVar18), _Var9))
            {
              iVar15 = iVar15 + 1;
              break;
            }
            version1 = version1 + 1;
          } while (uVar18 != version1);
        }
      }
      else {
        ts_stack_remove_version(self->stack,uVar18);
        ts_subtree_array_delete(pool,&local_78);
        iVar15 = iVar15 + 1;
        iVar24 = (int)local_68;
        do {
          iVar17 = (int)uVar11;
          uVar18 = iVar17 + 1;
          if ((uint)local_b0 <= uVar18) break;
          local_98 = *(undefined8 *)&pSVar25[uVar18].version;
          pSVar2 = pSVar25 + uVar18;
          local_a8.actions = (TSParseAction *)(pSVar2->subtrees).contents;
          local_a8.action_count = (pSVar2->subtrees).size;
          local_a8._12_4_ = (pSVar2->subtrees).capacity;
          iVar23 = (int)local_98;
          if (iVar23 == iVar24) {
            ts_subtree_array_delete(pool,(SubtreeArray *)&local_a8);
            uVar11 = (ulong)uVar18;
          }
          iVar17 = (int)uVar11;
        } while (iVar23 == iVar24);
      }
      local_b0._0_4_ = (uint)uVar6;
      local_b0._4_4_ = SUB84(uVar6,4);
      SVar29.size = (uint)local_b0;
      SVar29.capacity = local_b0._4_4_;
      SVar29.contents = pSVar25;
      uVar11 = (ulong)(iVar17 + 1U);
    } while (iVar17 + 1U < uVar10);
  }
  uVar10 = 0xffffffff;
  if (uVar4 < (self->stack->heads).size) {
    uVar10 = uVar4;
  }
  return uVar10;
}

Assistant:

static StackVersion ts_parser__reduce(TSParser *self, StackVersion version, TSSymbol symbol,
                                      uint32_t count, int dynamic_precedence,
                                      uint16_t alias_sequence_id, bool fragile) {
  uint32_t initial_version_count = ts_stack_version_count(self->stack);
  uint32_t removed_version_count = 0;
  StackSliceArray pop = ts_stack_pop_count(self->stack, version, count);

  for (uint32_t i = 0; i < pop.size; i++) {
    StackSlice slice = pop.contents[i];
    StackVersion slice_version = slice.version - removed_version_count;

    // Error recovery can sometimes cause lots of stack versions to merge,
    // such that a single pop operation can produce a lots of slices.
    // Avoid creating too many stack versions in that situation.
    if (i > 0 && slice_version > MAX_VERSION_COUNT + MAX_VERSION_COUNT_OVERFLOW) {
      ts_stack_remove_version(self->stack, slice_version);
      ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
      removed_version_count++;
      while (i + 1 < pop.size) {
        StackSlice next_slice = pop.contents[i + 1];
        if (next_slice.version != slice.version) break;
        ts_subtree_array_delete(&self->tree_pool, &next_slice.subtrees);
        i++;
      }
      continue;
    }

    // Extra tokens on top of the stack should not be included in this new parent
    // node. They will be re-pushed onto the stack after the parent node is
    // created and pushed.
    SubtreeArray children = slice.subtrees;
    while (children.size > 0 && ts_subtree_extra(children.contents[children.size - 1])) {
      children.size--;
    }

    MutableSubtree parent = ts_subtree_new_node(&self->tree_pool,
      symbol, &children, alias_sequence_id, self->language
    );

    // This pop operation may have caused multiple stack versions to collapse
    // into one, because they all diverged from a common state. In that case,
    // choose one of the arrays of trees to be the parent node's children, and
    // delete the rest of the tree arrays.
    while (i + 1 < pop.size) {
      StackSlice next_slice = pop.contents[i + 1];
      if (next_slice.version != slice.version) break;
      i++;

      SubtreeArray children = next_slice.subtrees;
      while (children.size > 0 && ts_subtree_extra(children.contents[children.size - 1])) {
        children.size--;
      }

      if (ts_parser__replace_children(self, &parent, &children)) {
        ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
        slice = next_slice;
      } else {
        ts_subtree_array_delete(&self->tree_pool, &next_slice.subtrees);
      }
    }

    parent.ptr->dynamic_precedence += dynamic_precedence;
    parent.ptr->alias_sequence_id = alias_sequence_id;

    TSStateId state = ts_stack_state(self->stack, slice_version);
    TSStateId next_state = ts_language_next_state(self->language, state, symbol);
    if (fragile || pop.size > 1 || initial_version_count > 1) {
      parent.ptr->fragile_left = true;
      parent.ptr->fragile_right = true;
      parent.ptr->parse_state = TS_TREE_STATE_NONE;
    } else {
      parent.ptr->parse_state = state;
    }

    // Push the parent node onto the stack, along with any extra tokens that
    // were previously on top of the stack.
    ts_stack_push(self->stack, slice_version, ts_subtree_from_mut(parent), false, next_state);
    for (uint32_t j = parent.ptr->child_count; j < slice.subtrees.size; j++) {
      ts_stack_push(self->stack, slice_version, slice.subtrees.contents[j], false, next_state);
    }

    for (StackVersion j = 0; j < slice_version; j++) {
      if (j == version) continue;
      if (ts_stack_merge(self->stack, j, slice_version)) {
        removed_version_count++;
        break;
      }
    }
  }

  // Return the first new stack version that was created.
  return ts_stack_version_count(self->stack) > initial_version_count
    ? initial_version_count
    : STACK_VERSION_NONE;
}